

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

void __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_0,_8L,_4L,_(ggml_type)8>::forward_mul_mat
          (tensor_traits<block_q4_0,_8L,_4L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  ggml_tensor *pgVar1;
  size_t bs;
  ggml_tensor *pgVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t iVar5;
  size_t sVar6;
  int64_t n_per_row;
  ggml_from_float_t p_Var7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ggml_type_traits_cpu *pgVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  int64_t extraout_RDX;
  int64_t nrow;
  int64_t extraout_RDX_00;
  size_t sVar17;
  ulong extraout_RDX_01;
  size_t extraout_RDX_02;
  long lVar18;
  ulong uVar19;
  undefined8 uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  void *vy;
  void *pvVar24;
  
  pgVar1 = op->src[0];
  bs = pgVar1->ne[1];
  if (op->ne[0] == bs) {
    pgVar2 = op->src[1];
    uVar3 = pgVar2->ne[1];
    if (op->ne[1] == uVar3) {
      if (op->ne[2] == pgVar2->ne[2]) {
        if (op->ne[3] == pgVar2->ne[3]) {
          if (op->nb[0] == 4) {
            uVar4 = op->nb[1];
            if (uVar4 < 4) {
              pcVar16 = "nb0 <= nb1";
              uVar20 = 0x17ca;
            }
            else if (op->nb[2] < uVar4) {
              pcVar16 = "nb1 <= nb2";
              uVar20 = 0x17cb;
            }
            else if (op->nb[3] < op->nb[2]) {
              pcVar16 = "nb2 <= nb3";
              uVar20 = 0x17cc;
            }
            else if (pgVar2->type == GGML_TYPE_F32) {
              iVar5 = pgVar1->ne[0];
              sVar6 = pgVar1->nb[1];
              n_per_row = pgVar2->ne[0];
              sVar17 = pgVar2->nb[1];
              lVar22 = (long)params->ith;
              iVar21 = params->nth;
              uVar9 = (ulong)iVar21;
              iVar8 = ggml_n_dims();
              if (iVar8 == 2) {
                pvVar24 = params->wdata;
                lVar10 = ggml_row_size(8,n_per_row);
                pgVar11 = ggml_get_type_traits_cpu(GGML_TYPE_Q8_0);
                uVar23 = lVar22 * 4;
                p_Var7 = pgVar11->from_float;
                uVar12 = uVar3 + 3;
                if (-1 < (long)uVar3) {
                  uVar12 = uVar3;
                }
                uVar12 = uVar12 & 0xfffffffffffffffc;
                if (uVar12 != uVar23 && SBORROW8(uVar12,uVar23) == (long)(uVar12 + lVar22 * -4) < 0)
                {
                  lVar13 = (long)(iVar21 * 4);
                  vy = (void *)(lVar10 * uVar23 + (long)pvVar24);
                  lVar18 = sVar17 * uVar23;
                  nrow = extraout_RDX;
                  do {
                    ggml_quantize_mat_t<8l,(ggml_type)8>
                              ((float *)((long)pgVar2->data + lVar18),vy,nrow,n_per_row);
                    uVar23 = uVar23 + lVar13;
                    vy = (void *)((long)vy + lVar10 * lVar13);
                    lVar18 = lVar18 + sVar17 * lVar13;
                    nrow = extraout_RDX_00;
                  } while ((long)uVar23 < (long)uVar12);
                }
                lVar13 = uVar12 + lVar22;
                if (lVar13 < (long)uVar3) {
                  pvVar24 = (void *)((long)pvVar24 + lVar10 * lVar13);
                  lVar18 = sVar17 * lVar13;
                  do {
                    (*p_Var7)((float *)((long)pgVar2->data + lVar18),pvVar24,n_per_row);
                    lVar13 = lVar13 + uVar9;
                    pvVar24 = (void *)((long)pvVar24 + lVar10 * uVar9);
                    lVar18 = lVar18 + sVar17 * uVar9;
                  } while (lVar13 < (long)uVar3);
                }
                ggml_barrier(params->threadpool);
                pvVar24 = params->wdata;
                lVar10 = ggml_row_size(8,n_per_row);
                uVar14 = (long)(bs * lVar22) / (long)uVar9;
                uVar15 = (long)((lVar22 + 1) * bs) / (long)uVar9;
                uVar23 = uVar14 + 3;
                if (-1 < (long)uVar14) {
                  uVar23 = uVar14;
                }
                sVar17 = uVar23 & 0xfffffffffffffffc;
                uVar23 = sVar17 + 4;
                if (uVar14 == sVar17) {
                  uVar23 = uVar14;
                }
                uVar14 = uVar15 + 3;
                if (-1 < (long)uVar15) {
                  uVar14 = uVar15;
                }
                uVar19 = (uVar14 & 0xfffffffffffffffc) + 4;
                if (uVar15 == (uVar14 & 0xfffffffffffffffc)) {
                  uVar19 = uVar15;
                }
                if ((long)uVar23 < (long)uVar19) {
                  iVar21 = (int)iVar5;
                  iVar8 = (int)uVar12;
                  if (3 < (long)uVar3) {
                    gemm<block_q4_0,8l,4l,(ggml_type)8>
                              (iVar21,(float *)(uVar23 * 4 + (long)op->data),bs,
                               (void *)(uVar23 * sVar6 + (long)pgVar1->data),pvVar24,iVar8,
                               (int)uVar19 - (int)uVar23);
                    sVar17 = extraout_RDX_01;
                    uVar9 = uVar12;
                  }
                  lVar22 = (long)iVar8;
                  if (lVar22 < (long)uVar3) {
                    lVar13 = uVar4 * lVar22 + uVar23 * 4;
                    pvVar24 = (void *)((long)pvVar24 + lVar10 * lVar22);
                    do {
                      gemv<block_q4_0,8l,4l,(ggml_type)8>
                                (iVar21,(float *)((long)op->data + lVar13),sVar17,
                                 (void *)((long)pgVar1->data + sVar6 * uVar23),pvVar24,(int)uVar9,
                                 (int)uVar19 - (int)uVar23);
                      lVar22 = lVar22 + 1;
                      lVar13 = lVar13 + uVar4;
                      pvVar24 = (void *)((long)pvVar24 + lVar10);
                      sVar17 = extraout_RDX_02;
                    } while (lVar22 < (long)uVar3);
                  }
                }
                return;
              }
              pcVar16 = "ggml_n_dims(op->src[0]) == 2";
              uVar20 = 0x17d0;
            }
            else {
              pcVar16 = "src1->type == GGML_TYPE_F32";
              uVar20 = 0x17ce;
            }
          }
          else {
            pcVar16 = "nb0 == sizeof(float)";
            uVar20 = 0x17c9;
          }
        }
        else {
          pcVar16 = "ne3 == ne13";
          uVar20 = 0x17c6;
        }
      }
      else {
        pcVar16 = "ne2 == ne12";
        uVar20 = 0x17c5;
      }
    }
    else {
      pcVar16 = "ne1 == ne11";
      uVar20 = 0x17c4;
    }
  }
  else {
    pcVar16 = "ne0 == ne01";
    uVar20 = 0x17c3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar20,"GGML_ASSERT(%s) failed",pcVar16);
}

Assistant:

void forward_mul_mat(ggml_compute_params * params, ggml_tensor * op) {
        const ggml_tensor * src0 = op->src[0];
        const ggml_tensor * src1 = op->src[1];
        ggml_tensor *       dst  = op;

        GGML_TENSOR_BINARY_OP_LOCALS

        const int ith = params->ith;
        const int nth = params->nth;

        GGML_ASSERT(ne0 == ne01);
        GGML_ASSERT(ne1 == ne11);
        GGML_ASSERT(ne2 == ne12);
        GGML_ASSERT(ne3 == ne13);

        // dst cannot be transposed or permuted
        GGML_ASSERT(nb0 == sizeof(float));
        GGML_ASSERT(nb0 <= nb1);
        GGML_ASSERT(nb1 <= nb2);
        GGML_ASSERT(nb2 <= nb3);

        GGML_ASSERT(src1->type == GGML_TYPE_F32);

        GGML_ASSERT(ggml_n_dims(op->src[0]) == 2);
        // GGML_ASSERT(ggml_n_dims(op->src[1]) == 2);

        char *       wdata = static_cast<char *>(params->wdata);
        const size_t nbw1  = ggml_row_size(PARAM_TYPE, ne10);

        assert(params->wsize >= nbw1 * ne11);

        const ggml_from_float_t from_float = ggml_get_type_traits_cpu(PARAM_TYPE)->from_float;

        int64_t i11_processed = 0;
        for (int64_t i11 = ith * 4; i11 < ne11 - ne11 % 4; i11 += nth * 4) {
            ggml_quantize_mat_t<INTER_SIZE, PARAM_TYPE>((float *) ((char *) src1->data + i11 * nb11), (void *) (wdata + i11 * nbw1), 4, ne10);
        }

        i11_processed = ne11 - ne11 % 4;
        for (int64_t i11 = i11_processed + ith; i11 < ne11; i11 += nth) {
            from_float((float *) ((char *) src1->data + i11 * nb11), (void *) (wdata + i11 * nbw1), ne10);
        }

        ggml_barrier(params->threadpool);

        const void * src1_wdata      = params->wdata;
        const size_t src1_col_stride = ggml_row_size(PARAM_TYPE, ne10);
        int64_t      src0_start      = (ith * ne01) / nth;
        int64_t      src0_end        = ((ith + 1) * ne01) / nth;
        src0_start = (src0_start % NB_COLS) ? src0_start + NB_COLS - (src0_start % NB_COLS) : src0_start;
        src0_end   = (src0_end   % NB_COLS) ? src0_end   + NB_COLS - (src0_end   % NB_COLS) : src0_end;
        if (src0_start >= src0_end) {
            return;
        }

        // If there are more than three rows in src1, use gemm; otherwise, use gemv.
        if (ne11 > 3) {
            gemm<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                    (float *) ((char *) dst->data) + src0_start, ne01,
                    (const char *) src0->data + src0_start * nb01,
                    (const char *) src1_wdata, ne11 - ne11 % 4, src0_end - src0_start);
        }
        for (int iter = ne11 - ne11 % 4; iter < ne11; iter++) {
            gemv<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                    (float *) ((char *) dst->data + (iter * nb1)) + src0_start, ne01,
                    (const char *) src0->data + src0_start * nb01,
                    (const char *) src1_wdata + (src1_col_stride * iter), 1,
                    src0_end - src0_start);
        }
    }